

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_int,signed_char>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_02;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_03;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_04;
  char u2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  uint t;
  char u;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe66;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe67;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffe70;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  undefined4 in_stack_fffffffffffffe74;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_11 [8];
  byte local_9;
  uint local_8;
  char local_1;
  
  local_1 = '\0';
  local_8 = 0;
  local_9 = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<signed_char>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (local_11,&local_1);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<signed_char>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_9 = (local_9 ^ 0xff) & 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  SafeInt::operator_cast_to_signed_char
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
            );
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe70
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator*((char)(in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe67
            );
  local_1 = '\x01';
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe70
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((uint)in_stack_fffffffffffffe74 >> 0x18));
  local_1 = '\x01';
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe70
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator/((char)((uint)in_stack_fffffffffffffe6c >> 0x18),in_stack_fffffffffffffe70);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((uint)in_stack_fffffffffffffe74 >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe70
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator+((char)(in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((uint)in_stack_fffffffffffffe74 >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_1 = '\0';
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe70
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator-((char)(in_stack_fffffffffffffe5c >> 0x18),in_stack_fffffffffffffe60);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)((uint)in_stack_fffffffffffffe74 >> 0x18));
  local_1 = '\x01';
  SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70.m_int),
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  rhs_02.m_int = (char)((uint)in_stack_fffffffffffffe74 >> 0x18);
  SVar1.m_int = (char)(in_stack_fffffffffffffe70.m_int >> 0x18);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe67.m_int);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),SVar1);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator<<(in_stack_fffffffffffffe5c,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)(in_stack_fffffffffffffe60.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe67
            );
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe67.m_int);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),SVar1);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator>>(in_stack_fffffffffffffe5c,
             (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)(in_stack_fffffffffffffe60.m_int >> 0x18));
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe67
            );
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe60
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator&(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe67.m_int,
                                 CONCAT16(in_stack_fffffffffffffe66.m_int,
                                          CONCAT24(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60.m_int))));
  rhs.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),rhs);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),rhs_02);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe60
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator|(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe67.m_int,
                                 CONCAT16(in_stack_fffffffffffffe66.m_int,
                                          CONCAT24(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60.m_int))));
  rhs_00.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_00.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),rhs_00);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),rhs_02);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),in_stack_fffffffffffffe60
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),'\0');
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT17(in_stack_fffffffffffffe67.m_int,
                                   CONCAT16(in_stack_fffffffffffffe66.m_int,
                                            CONCAT24(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60.m_int))));
  operator^(in_stack_fffffffffffffe60.m_int,in_stack_fffffffffffffe66);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_fffffffffffffe67.m_int,
                                 CONCAT16(in_stack_fffffffffffffe66.m_int,
                                          CONCAT24(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60.m_int))));
  rhs_01.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffe64;
  rhs_01.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),rhs_01);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_fffffffffffffe67.m_int,
                      CONCAT16(in_stack_fffffffffffffe66.m_int,
                               CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60.m_int)))
             ,(char)(in_stack_fffffffffffffe5c >> 0x18));
  SVar1.m_int = (char)(in_stack_fffffffffffffe60.m_int >> 0x18);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),rhs_02);
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,(SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           )0x0);
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,'\0');
  local_9 = operator<('\0',(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,(SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                           )0x0);
  lhs.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(lhs,SVar1);
  local_9 = operator<=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,'\0');
  local_9 = operator<=('\0',(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  lhs_00.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_00.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_00.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator<=(lhs_00,SVar1);
  lhs_01.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_01.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_01.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(lhs_01,SVar1);
  local_9 = operator>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,'\0');
  local_9 = operator>('\0',(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  lhs_02.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_02.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_02.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator>(lhs_02,SVar1);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,(SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,'\0');
  local_9 = operator>=('\0',(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,(SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  lhs_03.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_03.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_03.m_int._3_1_ = in_stack_fffffffffffffe67.m_int;
  local_9 = operator==(lhs_03,SVar1);
  local_9 = operator==((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,'\0');
  local_9 = operator==('\0',(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  lhs_04.m_int._2_1_ = in_stack_fffffffffffffe66.m_int;
  lhs_04.m_int._0_2_ = in_stack_fffffffffffffe64;
  lhs_04.m_int._3_1_ = local_11[0].m_int;
  operator==(lhs_04,SVar1);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}